

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

JitEquivalentTypeGuard * __thiscall
Lowerer::CreateEquivalentTypeGuardAndLinkToGuardedProperties
          (Lowerer *this,PropertySymOpnd *propertySymOpnd)

{
  ushort uVar1;
  Type TVar2;
  Func *pFVar3;
  BVSparse<Memory::JitArenaAllocator> *pBVar4;
  JitArenaAllocator *this_00;
  code *pcVar5;
  int iVar6;
  bool bVar7;
  bool bVar8;
  ushort uVar9;
  uint16 uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  BVIndex BVar14;
  TypeId typeId;
  BOOL BVar15;
  undefined4 *puVar16;
  EquivalentTypeSet *pEVar17;
  JITType *pJVar18;
  ulong uVar19;
  JITTypeHolder type;
  FunctionJITTimeInfo *pFVar20;
  ObjTypeSpecFldInfo *pOVar21;
  JITTimeFunctionBody *pJVar22;
  char16 *pcVar23;
  char16 *pcVar24;
  EquivalentTypeCache *pEVar25;
  Type *pTVar26;
  EquivalentPropertyEntry *__dest;
  RecyclableObject *pRVar27;
  Type_conflict pBVar28;
  size_t requestSize;
  byte bVar29;
  Lowerer *pLVar30;
  ulong uVar31;
  JITTypeHolderBase<void> local_138;
  char16 debugStringBuffer [42];
  undefined1 local_d8 [8];
  BaseDictionary<int,_Js::EquivalentPropertyEntry_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  propIds;
  char *local_80;
  JitPolyEquivalentTypeGuard *local_78;
  EquivalentPropertyEntry *local_70;
  EquivalentPropertyEntry *entry;
  Lowerer *local_60;
  undefined4 *local_58;
  EquivalentTypeCache *local_50;
  uint local_44;
  uint uStack_40;
  PropertyId propertyId;
  char local_31;
  
  if (((propertySymOpnd->objTypeSpecFldInfo == (ObjTypeSpecFldInfo *)0x0) ||
      (bVar7 = ObjTypeSpecFldInfo::HasEquivalentTypeSet(propertySymOpnd->objTypeSpecFldInfo), !bVar7
      )) || (propertySymOpnd->guardedPropOps == (BVSparse<Memory::JitArenaAllocator> *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar16 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1f15,
                       "(propertySymOpnd->HasObjTypeSpecFldInfo() && propertySymOpnd->HasEquivalentTypeSet() && propertySymOpnd->GetGuardedPropOps())"
                       ,
                       "propertySymOpnd->HasObjTypeSpecFldInfo() && propertySymOpnd->HasEquivalentTypeSet() && propertySymOpnd->GetGuardedPropOps()"
                      );
    if (!bVar7) goto LAB_005cd950;
    *puVar16 = 0;
  }
  bVar7 = IR::PropertySymOpnd::ShouldUsePolyEquivTypeGuard(propertySymOpnd,this->m_func);
  pFVar3 = this->m_func;
  if (bVar7) {
    uVar11 = IR::PropertySymOpnd::GetObjTypeSpecFldId(propertySymOpnd);
    local_78 = Func::CreatePolyEquivalentTypeGuard(pFVar3,uVar11);
    pEVar17 = IR::PropertySymOpnd::GetEquivalentTypeSet(propertySymOpnd);
    if (pEVar17->count != 0) {
      uVar10 = 0;
      do {
        local_138.t = (Type)Js::EquivalentTypeSet::GetType(pEVar17,uVar10);
        pJVar18 = JITTypeHolderBase<void>::operator->(&local_138);
        uVar19 = JITType::GetAddr(pJVar18);
        Js::JitPolyEquivalentTypeGuard::SetPolyValue(local_78,uVar19,(byte)(uVar19 >> 6) & 7);
        uVar10 = uVar10 + 1;
      } while (uVar10 < pEVar17->count);
    }
  }
  else {
    type = IR::PropertySymOpnd::GetFirstEquivalentType(propertySymOpnd);
    uVar11 = IR::PropertySymOpnd::GetObjTypeSpecFldId(propertySymOpnd);
    local_78 = (JitPolyEquivalentTypeGuard *)Func::CreateEquivalentTypeGuard(pFVar3,type,uVar11);
  }
  pFVar20 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
  bVar7 = FunctionJITTimeInfo::HasSharedPropertyGuards(pFVar20);
  local_60 = this;
  if (bVar7) {
    pBVar4 = propertySymOpnd->guardedPropOps;
    pFVar20 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
    bVar7 = FunctionJITTimeInfo::HasSharedPropertyGuards(pFVar20);
    if (!bVar7) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar16 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x1fd8,
                         "(this->m_func->GetWorkItem()->GetJITTimeInfo()->HasSharedPropertyGuards())"
                         ,"this->m_func->GetWorkItem()->GetJITTimeInfo()->HasSharedPropertyGuards()"
                        );
      if (!bVar7) goto LAB_005cd950;
      *puVar16 = 0;
    }
    if (pBVar4 == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar16 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x1fd9,"(guardedPropOps != nullptr)","guardedPropOps != nullptr");
      if (!bVar7) goto LAB_005cd950;
      *puVar16 = 0;
    }
    pEVar25 = (EquivalentTypeCache *)pBVar4->head;
    if (pEVar25 != (EquivalentTypeCache *)0x0) {
      local_58 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      _uStack_40 = (Phases *)&DAT_015b6718;
      do {
        pRVar27 = ((Type *)(pEVar25->types + 2))->ptr;
        local_50 = pEVar25;
        if (pRVar27 != (RecyclableObject *)0x0) {
          entry = (EquivalentPropertyEntry *)(ulong)*(uint *)&((Type *)(pEVar25->types + 1))->ptr;
          uVar19 = 0;
          if (pRVar27 != (RecyclableObject *)0x0) {
            for (; ((ulong)pRVar27 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
            }
          }
          do {
            iVar6 = (int)entry;
            BVUnitT<unsigned_long>::AssertRange((BVIndex)uVar19);
            pOVar21 = Func::GetGlobalObjTypeSpecFldInfo(this->m_func,iVar6 + (BVIndex)uVar19);
            uVar12 = ObjTypeSpecFldInfo::GetPropertyId(pOVar21);
            bVar7 = ObjTypeSpecFldInfo::IsBeingAdded(pOVar21);
            if (((bVar7) || (bVar7 = ObjTypeSpecFldInfo::IsLoadedFromProto(pOVar21), bVar7)) ||
               (bVar7 = ObjTypeSpecFldInfo::HasFixedValue(pOVar21), bVar7)) {
              bVar7 = ObjTypeSpecFldInfo::IsPoly(pOVar21);
              if (((bVar7) && (bVar7 = ObjTypeSpecFldInfo::HasFixedValue(pOVar21), bVar7)) &&
                 ((bVar7 = ObjTypeSpecFldInfo::IsLoadedFromProto(pOVar21), !bVar7 &&
                  (bVar7 = ObjTypeSpecFldInfo::UsesAccessor(pOVar21), !bVar7)))) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar16 = local_58;
                *local_58 = 1;
                bVar7 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                                   ,0x1fee,
                                   "(!propertyOpInfo->IsPoly() || (!propertyOpInfo->HasFixedValue() || propertyOpInfo->IsLoadedFromProto() || propertyOpInfo->UsesAccessor()))"
                                   ,
                                   "!propertyOpInfo->IsPoly() || (!propertyOpInfo->HasFixedValue() || propertyOpInfo->IsLoadedFromProto() || propertyOpInfo->UsesAccessor())"
                                  );
                if (!bVar7) goto LAB_005cd950;
                *puVar16 = 0;
              }
              pLVar30 = local_60;
              pFVar20 = JITTimeWorkItem::GetJITTimeInfo(local_60->m_func->m_workItem);
              bVar7 = FunctionJITTimeInfo::HasSharedPropertyGuard(pFVar20,uVar12);
              if (bVar7) {
                pJVar22 = JITTimeWorkItem::GetJITFunctionBody(pLVar30->m_func->m_workItem);
                uVar11 = JITTimeFunctionBody::GetSourceContextId(pJVar22);
                pFVar20 = JITTimeWorkItem::GetJITTimeInfo(pLVar30->m_func->m_workItem);
                uVar13 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar20);
                bVar7 = Js::Phases::IsEnabled(_uStack_40,ObjTypeSpecPhase,uVar11,uVar13);
                if (bVar7) {
LAB_005cd120:
                  pJVar22 = JITTimeWorkItem::GetJITFunctionBody(pLVar30->m_func->m_workItem);
                  pcVar23 = JITTimeFunctionBody::GetDisplayName(pJVar22);
                  pFVar20 = JITTimeWorkItem::GetJITTimeInfo(pLVar30->m_func->m_workItem);
                  pcVar24 = FunctionJITTimeInfo::GetDebugNumberSet
                                      (pFVar20,(wchar (*) [42])&local_138);
                  Output::Print(L"ObjTypeSpec: function %s(%s) registered equivalent type spec guard 0x%p with value 0x%p for property ID %u.\n"
                                ,pcVar23,pcVar24,local_78,
                                (local_78->super_JitEquivalentTypeGuard).
                                super_JitIndexedPropertyGuard.super_PropertyGuard.value,
                                (ulong)uVar12);
                  Output::Flush();
                }
                else {
                  pJVar22 = JITTimeWorkItem::GetJITFunctionBody(pLVar30->m_func->m_workItem);
                  uVar11 = JITTimeFunctionBody::GetSourceContextId(pJVar22);
                  pFVar20 = JITTimeWorkItem::GetJITTimeInfo(pLVar30->m_func->m_workItem);
                  uVar13 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar20);
                  bVar7 = Js::Phases::IsEnabled(_uStack_40,TracePropertyGuardsPhase,uVar11,uVar13);
                  if (bVar7) goto LAB_005cd120;
                }
                Func::EnsurePropertyGuardsByPropertyId(pLVar30->m_func);
                Func::LinkGuardToPropertyId
                          (pLVar30->m_func,uVar12,(JitIndexedPropertyGuard *)local_78);
              }
              else {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar16 = local_58;
                *local_58 = 1;
                bVar7 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                                   ,0x1ff7,"(false)",
                                   "Did we fail to create a shared property guard for a guarded property?"
                                  );
                if (!bVar7) goto LAB_005cd950;
                *puVar16 = 0;
              }
            }
            pRVar27 = (RecyclableObject *)((ulong)pRVar27 & ~(1L << (uVar19 & 0x3f)));
            uVar19 = 0;
            if (pRVar27 != (RecyclableObject *)0x0) {
              for (; ((ulong)pRVar27 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
              }
            }
            this = local_60;
          } while (pRVar27 != (RecyclableObject *)0x0);
        }
        pEVar25 = (EquivalentTypeCache *)local_50->types[0];
      } while (pEVar25 != (EquivalentTypeCache *)0x0);
    }
  }
  pEVar25 = (local_78->super_JitEquivalentTypeGuard).cache;
  if (pEVar25 == (EquivalentTypeCache *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar16 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1f3d,"(guard->GetCache() != nullptr)","guard->GetCache() != nullptr");
    if (!bVar7) goto LAB_005cd950;
    *puVar16 = 0;
    pEVar25 = (local_78->super_JitEquivalentTypeGuard).cache;
  }
  local_50 = pEVar25;
  pEVar17 = IR::PropertySymOpnd::GetEquivalentTypeSet(propertySymOpnd);
  pEVar25 = local_50;
  uVar1 = pEVar17->count;
  uVar9 = 8;
  if (uVar1 < 8) {
    uVar9 = uVar1;
  }
  if (uVar1 != 0) {
    entry = (EquivalentPropertyEntry *)CONCAT44(entry._4_4_,(uint)uVar1);
    uVar19 = 0;
    do {
      local_138.t = (Type)Js::EquivalentTypeSet::GetType(pEVar17,(uint16)uVar19);
      pJVar18 = JITTypeHolderBase<void>::operator->(&local_138);
      pTVar26 = (Type *)JITType::GetAddr(pJVar18);
      pEVar25->types[uVar19] = pTVar26;
      uVar19 = uVar19 + 1;
    } while (uVar9 != uVar19);
    if ((PropertyIndex)entry != 0) {
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      uVar19 = 0;
      bVar29 = 0;
      do {
        bVar7 = local_50->types[uVar19] == (Type *)0x0;
        if ((bool)(~bVar29 & 1) || bVar7) {
          bVar29 = bVar29 | bVar7;
        }
        else {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar16 = 1;
          bVar7 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x1f57,"(false)","there_was_a_null_type ? something is wrong here.");
          if (!bVar7) goto LAB_005cd950;
          *puVar16 = 0;
        }
        uVar19 = uVar19 + 1;
      } while (uVar9 != uVar19);
    }
  }
  pLVar30 = local_60;
  pBVar4 = propertySymOpnd->guardedPropOps;
  uVar12 = 0;
  for (pBVar28 = pBVar4->head; pBVar28 != (Type_conflict)0x0; pBVar28 = pBVar28->next) {
    BVar14 = BVUnitT<unsigned_long>::CountBit((pBVar28->data).word);
    uVar12 = uVar12 + BVar14;
  }
  local_138.t = (Type)IR::PropertySymOpnd::GetFirstEquivalentType(propertySymOpnd);
  pJVar18 = JITTypeHolderBase<void>::operator->(&local_138);
  typeId = JITType::GetTypeId(pJVar18);
  local_31 = Js::StaticType::Is(typeId);
  JsUtil::
  BaseDictionary<int,_Js::EquivalentPropertyEntry_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary((BaseDictionary<int,_Js::EquivalentPropertyEntry_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                    *)local_d8,pLVar30->m_alloc,uVar12);
  if (uVar12 == 0) {
    local_80 = &DAT_00000008;
  }
  else {
    this_00 = pLVar30->m_alloc;
    BVar15 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar15 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar16 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                         "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar7) goto LAB_005cd950;
      *puVar16 = 0;
    }
    local_80 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
               AllocInternal((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                             this_00,(ulong)uVar12 << 3);
    if (local_80 == (char *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar16 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar7) goto LAB_005cd950;
      *puVar16 = 0;
      local_80 = (char *)0x0;
    }
  }
  pBVar28 = pBVar4->head;
  if (pBVar28 == (Type_conflict)0x0) {
    _uStack_40 = (Phases *)((ulong)_uStack_40 & 0xffffffff00000000);
  }
  else {
    local_58 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    propIds.stats = (Type)&DAT_015b6718;
    _uStack_40 = (Phases *)((ulong)_uStack_40 & 0xffffffff00000000);
    do {
      uVar19 = (pBVar28->data).word;
      if (uVar19 != 0) {
        TVar2 = pBVar28->startIndex;
        uVar31 = 0;
        if (uVar19 != 0) {
          for (; (uVar19 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
          }
        }
        do {
          BVUnitT<unsigned_long>::AssertRange((BVIndex)uVar31);
          pOVar21 = Func::GetGlobalObjTypeSpecFldInfo(pLVar30->m_func,TVar2 + (BVIndex)uVar31);
          local_44 = ObjTypeSpecFldInfo::GetPropertyId(pOVar21);
          bVar7 = ObjTypeSpecFldInfo::HasFixedValue(pOVar21);
          if (bVar7) {
            local_50->hasFixedValue = true;
          }
          bVar7 = ObjTypeSpecFldInfo::IsLoadedFromProto(pOVar21);
          if (bVar7) {
            local_50->isLoadedFromProto = true;
            entry = (EquivalentPropertyEntry *)CONCAT62(entry._2_6_,0xffff);
          }
          else {
            uVar10 = ObjTypeSpecFldInfo::GetSlotIndex(pOVar21);
            entry = (EquivalentPropertyEntry *)CONCAT62(entry._2_6_,uVar10);
          }
          bVar7 = ObjTypeSpecFldInfo::UsesAuxSlot(pOVar21);
          if ((local_31 != '\0') && (bVar8 = ObjTypeSpecFldInfo::IsBeingStored(pOVar21), bVar8)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *local_58 = 1;
            bVar8 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                               ,0x1f7e,"(!isTypeStatic || !propOpInfo->IsBeingStored())",
                               "Why are we storing a field to an object of static type?");
            if (!bVar8) goto LAB_005cd950;
            *local_58 = 0;
          }
          local_70 = (EquivalentPropertyEntry *)0x0;
          bVar8 = JsUtil::
                  BaseDictionary<int,_Js::EquivalentPropertyEntry_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                  ::TryGetValue<int>((BaseDictionary<int,_Js::EquivalentPropertyEntry_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                                      *)local_d8,(int *)&local_44,&local_70);
          if (bVar8) {
            if (((PropertyIndex)entry == local_70->slotIndex) && (local_70->isAuxSlot == bVar7)) {
              bVar7 = ObjTypeSpecFldInfo::IsBeingStored(pOVar21);
              local_70->mustBeWritable = (bool)(local_70->mustBeWritable | bVar7);
            }
            else {
              pJVar22 = JITTimeWorkItem::GetJITFunctionBody(local_60->m_func->m_workItem);
              uVar11 = JITTimeFunctionBody::GetSourceContextId(pJVar22);
              pFVar20 = JITTimeWorkItem::GetJITTimeInfo(local_60->m_func->m_workItem);
              uVar13 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar20);
              bVar8 = Js::Phases::IsEnabled
                                ((Phases *)propIds.stats,EquivObjTypeSpecPhase,uVar11,uVar13);
              if (bVar8) {
                pJVar22 = JITTimeWorkItem::GetJITFunctionBody(local_60->m_func->m_workItem);
                pcVar23 = JITTimeFunctionBody::GetDisplayName(pJVar22);
                pFVar20 = JITTimeWorkItem::GetJITTimeInfo(local_60->m_func->m_workItem);
                pcVar24 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar20,(wchar (*) [42])&local_138)
                ;
                Output::Print(L"EquivObjTypeSpec: top function %s (%s): duplicate property clash on %d \n"
                              ,pcVar23,pcVar24,(ulong)local_44);
                Output::Flush();
              }
              if (uVar12 <= uStack_40) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *local_58 = 1;
                bVar8 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                                   ,0x1f94,"(propIdCount < propOpCount)","propIdCount < propOpCount"
                                  );
                if (!bVar8) goto LAB_005cd950;
                *local_58 = 0;
              }
              local_70 = (EquivalentPropertyEntry *)(local_80 + (ulong)uStack_40 * 8);
              local_70->propertyId = local_44;
              local_70->slotIndex = (PropertyIndex)entry;
              local_70->isAuxSlot = bVar7;
              bVar7 = ObjTypeSpecFldInfo::IsBeingStored(pOVar21);
              _uStack_40 = (Phases *)CONCAT44(propertyId,uStack_40 + 1);
              local_70->mustBeWritable = bVar7;
            }
          }
          else {
            if (uVar12 <= uStack_40) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *local_58 = 1;
              bVar8 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                                 ,0x1f9f,"(propIdCount < propOpCount)","propIdCount < propOpCount");
              if (!bVar8) goto LAB_005cd950;
              *local_58 = 0;
            }
            local_70 = (EquivalentPropertyEntry *)(local_80 + (ulong)uStack_40 * 8);
            local_70->propertyId = local_44;
            local_70->slotIndex = (PropertyIndex)entry;
            local_70->isAuxSlot = bVar7;
            bVar7 = ObjTypeSpecFldInfo::IsBeingStored(pOVar21);
            local_70->mustBeWritable = bVar7;
            JsUtil::
            BaseDictionary<int,Js::EquivalentPropertyEntry*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
            ::
            Insert<(JsUtil::BaseDictionary<int,Js::EquivalentPropertyEntry*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)1>
                      ((BaseDictionary<int,Js::EquivalentPropertyEntry*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                        *)local_d8,(int *)&local_44,&local_70);
            _uStack_40 = (Phases *)CONCAT44(propertyId,uStack_40 + 1);
          }
          uVar19 = uVar19 & ~(1L << (uVar31 & 0x3f));
          uVar31 = 0;
          if (uVar19 != 0) {
            for (; (uVar19 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
            }
          }
          pLVar30 = local_60;
        } while (uVar19 != 0);
      }
      pBVar28 = pBVar28->next;
    } while (pBVar28 != (Type)0x0);
  }
  (local_50->record).propertyCount = uStack_40;
  pFVar3 = pLVar30->m_func->topFunc;
  BVar15 = ExceptionCheck::CanHandleOutOfMemory();
  if (BVar15 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar16 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                       ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                       "ExceptionCheck::CanHandleOutOfMemory()");
    if (!bVar7) goto LAB_005cd950;
    *puVar16 = 0;
  }
  requestSize = ((ulong)_uStack_40 & 0xffffffff) << 3;
  __dest = (EquivalentPropertyEntry *)
           NativeCodeData::Allocator::Alloc(&pFVar3->nativeCodeDataAllocator,requestSize);
  if (__dest == (EquivalentPropertyEntry *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar16 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                       ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
    if (!bVar7) {
LAB_005cd950:
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    *puVar16 = 0;
  }
  (local_50->record).properties = __dest;
  memcpy(__dest,local_80,requestSize);
  JsUtil::
  BaseDictionary<int,_Js::EquivalentPropertyEntry_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::~BaseDictionary((BaseDictionary<int,_Js::EquivalentPropertyEntry_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                     *)local_d8);
  return &local_78->super_JitEquivalentTypeGuard;
}

Assistant:

Js::JitEquivalentTypeGuard*
Lowerer::CreateEquivalentTypeGuardAndLinkToGuardedProperties(IR::PropertySymOpnd* propertySymOpnd)
{
    // We should always have a list of guarded properties.
    Assert(propertySymOpnd->HasObjTypeSpecFldInfo() && propertySymOpnd->HasEquivalentTypeSet() && propertySymOpnd->GetGuardedPropOps());

    Js::JitEquivalentTypeGuard* guard;
    if (propertySymOpnd->ShouldUsePolyEquivTypeGuard(this->m_func))
    {
        Js::JitPolyEquivalentTypeGuard *polyGuard = this->m_func->CreatePolyEquivalentTypeGuard(propertySymOpnd->GetObjTypeSpecFldId());

        // Copy types from the type set to the guard's value locations
        Js::EquivalentTypeSet* typeSet = propertySymOpnd->GetEquivalentTypeSet();
        for (uint16 ti = 0; ti < typeSet->GetCount(); ti++)
        {
            intptr_t typeToCache = typeSet->GetType(ti)->GetAddr();
            polyGuard->SetPolyValue(typeToCache, polyGuard->GetIndexForValue(typeToCache));
        }

        guard = polyGuard;
    }
    else
    {
        guard = this->m_func->CreateEquivalentTypeGuard(propertySymOpnd->GetFirstEquivalentType(), propertySymOpnd->GetObjTypeSpecFldId());
    }

    if (m_func->GetWorkItem()->GetJITTimeInfo()->HasSharedPropertyGuards())
    {
        LinkGuardToGuardedProperties(propertySymOpnd->GetGuardedPropOps(), [=](Js::PropertyId propertyId)
        {
            if (PHASE_TRACE(Js::ObjTypeSpecPhase, this->m_func) || PHASE_TRACE(Js::TracePropertyGuardsPhase, this->m_func))
            {
                char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
                Output::Print(_u("ObjTypeSpec: function %s(%s) registered equivalent type spec guard 0x%p with value 0x%p for property ID %u.\n"),
                    this->m_func->GetJITFunctionBody()->GetDisplayName(), this->m_func->GetDebugNumberSet(debugStringBuffer),
                    guard, guard->GetValue(), propertyId);
                Output::Flush();
            }

            this->m_func->EnsurePropertyGuardsByPropertyId();
            this->m_func->LinkGuardToPropertyId(propertyId, guard);
        });
    }

    Assert(guard->GetCache() != nullptr);
    Js::EquivalentTypeCache* cache = guard->GetCache();

    // TODO (ObjTypeSpec): If we delayed populating the types until encoder, we could bulk allocate all equivalent type caches
    // in one block from the heap. This would allow us to not allocate them from the native code data allocator and free them
    // when no longer needed. However, we would need to store the global property operation ID in the guard, so we can look up
    // the info in the encoder. Perhaps we could overload the cache pointer to be the ID until encoder.

    // Copy types from the type set to the guard's cache
    Js::EquivalentTypeSet* typeSet = propertySymOpnd->GetEquivalentTypeSet();
    uint16 cachedTypeCount = typeSet->GetCount() < EQUIVALENT_TYPE_CACHE_SIZE ? typeSet->GetCount() : EQUIVALENT_TYPE_CACHE_SIZE;
    for (uint16 ti = 0; ti < cachedTypeCount; ti++)
    {
        cache->types[ti] = (Js::Type*)typeSet->GetType(ti)->GetAddr();
    }

#ifdef DEBUG
    bool there_was_a_null_type = false;
    for (uint16 ti = 0; ti < cachedTypeCount; ti++)
    {
        if (cache->types[ti] == nullptr)
        {
            there_was_a_null_type = true;
        }
        else if (there_was_a_null_type)
        {
            AssertMsg(false, "there_was_a_null_type ? something is wrong here.");
        }
    }
#endif

    // Populate property ID and slot index arrays on the guard's cache. We iterate over the
    // bit vector of property operations protected by this guard, but some property operations
    // may be referring to the same property ID (but not share the same cache). We skip
    // redundant entries by maintaining a hash set of property IDs we've already encountered.

    auto propOps = propertySymOpnd->GetGuardedPropOps();
    uint propOpCount = propOps->Count();

    bool isTypeStatic = Js::StaticType::Is(propertySymOpnd->GetFirstEquivalentType()->GetTypeId());
    JsUtil::BaseDictionary<Js::PropertyId, Js::EquivalentPropertyEntry*, JitArenaAllocator> propIds(this->m_alloc, propOpCount);
    Js::EquivalentPropertyEntry* properties = AnewArray(this->m_alloc, Js::EquivalentPropertyEntry, propOpCount);
    uint propIdCount = 0;

    FOREACH_BITSET_IN_SPARSEBV(propOpId, propOps)
    {
        ObjTypeSpecFldInfo* propOpInfo = this->m_func->GetGlobalObjTypeSpecFldInfo(propOpId);
        Js::PropertyId propertyId = propOpInfo->GetPropertyId();
        Js::PropertyIndex propOpIndex = Js::Constants::NoSlot;
        bool hasFixedValue = propOpInfo->HasFixedValue();
        if (hasFixedValue)
        {
            cache->SetHasFixedValue();
        }
        bool isLoadedFromProto = propOpInfo->IsLoadedFromProto();
        if (isLoadedFromProto)
        {
            cache->SetIsLoadedFromProto();
        }
        else
        {
            propOpIndex = propOpInfo->GetSlotIndex();
        }
        bool propOpUsesAuxSlot = propOpInfo->UsesAuxSlot();

        AssertMsg(!isTypeStatic || !propOpInfo->IsBeingStored(), "Why are we storing a field to an object of static type?");

        Js::EquivalentPropertyEntry* entry = nullptr;
        if (propIds.TryGetValue(propertyId, &entry))
        {
            if (propOpIndex == entry->slotIndex && propOpUsesAuxSlot == entry->isAuxSlot)
            {
                entry->mustBeWritable |= propOpInfo->IsBeingStored();
            }
            else
            {
                // Due to inline cache sharing we have the same property accessed using different caches
                // with inconsistent info. This means a guaranteed bailout on the equivalent type check.
                // We'll just let it happen and turn off the optimization for this function. We could avoid
                // this problem by tracking property information on the value type in glob opt.
                if (PHASE_TRACE(Js::EquivObjTypeSpecPhase, this->m_func))
                {
                    char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
                    Output::Print(_u("EquivObjTypeSpec: top function %s (%s): duplicate property clash on %d \n"),
                        m_func->GetJITFunctionBody()->GetDisplayName(), m_func->GetDebugNumberSet(debugStringBuffer), propertyId);
                    Output::Flush();
                }
                Assert(propIdCount < propOpCount);
                __analysis_assume(propIdCount < propOpCount);
                entry = &properties[propIdCount++];
                entry->propertyId = propertyId;
                entry->slotIndex = propOpIndex;
                entry->isAuxSlot = propOpUsesAuxSlot;
                entry->mustBeWritable = propOpInfo->IsBeingStored();
            }
        }
        else
        {
            Assert(propIdCount < propOpCount);
            __analysis_assume(propIdCount < propOpCount);
            entry = &properties[propIdCount++];
            entry->propertyId = propertyId;
            entry->slotIndex = propOpIndex;
            entry->isAuxSlot = propOpUsesAuxSlot;
            entry->mustBeWritable = propOpInfo->IsBeingStored();
            propIds.AddNew(propertyId, entry);
        }
    }
    NEXT_BITSET_IN_SPARSEBV;

    cache->record.propertyCount = propIdCount;
    // Js::EquivalentPropertyEntry does not contain pointer, no need to fixup
    cache->record.properties = NativeCodeDataNewArrayNoFixup(this->m_func->GetNativeCodeDataAllocator(), Js::EquivalentPropertyEntry, propIdCount);

    memcpy(cache->record.properties, properties, propIdCount * sizeof(Js::EquivalentPropertyEntry));

    return guard;
}